

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_decoding_transform.h
# Opt level: O3

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronDecodingTransform<int> *this,Point2 *pred,Point2 *corr)

{
  int32_t *t;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *in_RCX;
  uint uVar6;
  int iVar7;
  
  iVar1 = pred[2].v_._M_elems[0];
  iVar4 = (corr->v_)._M_elems[0] - iVar1;
  iVar5 = (corr->v_)._M_elems[1] - iVar1;
  *(ulong *)(corr->v_)._M_elems = CONCAT44(iVar5,iVar4);
  iVar3 = -iVar4;
  if (0 < iVar4) {
    iVar3 = iVar4;
  }
  iVar7 = -iVar5;
  if (0 < iVar5) {
    iVar7 = iVar5;
  }
  uVar2 = pred[2].v_._M_elems[0];
  uVar6 = uVar2;
  if (uVar2 < (uint)(iVar7 + iVar3)) {
    OctahedronToolBox::InvertDiamond
              ((OctahedronToolBox *)pred,(int32_t *)corr,(corr->v_)._M_elems + 1);
    iVar4 = (corr->v_)._M_elems[0];
    iVar5 = (corr->v_)._M_elems[1];
    uVar6 = pred[2].v_._M_elems[0];
  }
  iVar4 = iVar4 + *in_RCX;
  iVar5 = iVar5 + in_RCX[1];
  if ((int)uVar6 < iVar4) {
    iVar4 = iVar4 - (pred->v_)._M_elems[1];
  }
  else if (SBORROW4(iVar4,-uVar6) != (int)(iVar4 + uVar6) < 0) {
    iVar4 = iVar4 + (pred->v_)._M_elems[1];
  }
  t = &(this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
       max_quantized_value_;
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  quantization_bits_ = iVar4;
  if ((int)uVar6 < iVar5) {
    iVar5 = iVar5 - (pred->v_)._M_elems[1];
  }
  else if (SBORROW4(iVar5,-uVar6) != (int)(iVar5 + uVar6) < 0) {
    iVar5 = iVar5 + (pred->v_)._M_elems[1];
  }
  *t = iVar5;
  if (uVar2 < (uint)(iVar7 + iVar3)) {
    OctahedronToolBox::InvertDiamond((OctahedronToolBox *)pred,(int32_t *)this,t);
    iVar4 = (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
            quantization_bits_;
    iVar5 = (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
            max_quantized_value_;
  }
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  quantization_bits_ = iVar4 + iVar1;
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  max_quantized_value_ = iVar5 + iVar1;
  return (Point2)(array<int,_2UL>)this;
}

Assistant:

Point2 ComputeOriginalValue(Point2 pred, const Point2 &corr) const {
    const Point2 t(this->center_value(), this->center_value());
    typedef typename std::make_unsigned<DataTypeT>::type UnsignedDataTypeT;
    typedef VectorD<UnsignedDataTypeT, 2> Point2u;

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    pred = Point2(Point2u(pred) - Point2u(t));

    const bool pred_is_in_diamond = this->IsInDiamond(pred[0], pred[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&pred[0], &pred[1]);
    }

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    Point2 orig(Point2u(pred) + Point2u(corr));

    orig[0] = this->ModMax(orig[0]);
    orig[1] = this->ModMax(orig[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&orig[0], &orig[1]);
    }

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    orig = Point2(Point2u(orig) + Point2u(t));
    return orig;
  }